

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockCheckedActualCall_unExpectedCallOnObject_Test::
~TEST_MockCheckedActualCall_unExpectedCallOnObject_Test
          (TEST_MockCheckedActualCall_unExpectedCallOnObject_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST(MockCheckedActualCall, unExpectedCallOnObject)
{
    int object;

    MockCheckedActualCall actualCall(1, reporter, *emptyList);
    actualCall.withName("unexpected").onObject(&object);

    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "unexpected", *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    CHECK(actualCall.hasFailed()); // Checks that onObject() doesn't "reset" call state
}